

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

void DoStreamSummary(SstStream Stream)

{
  long *plVar1;
  int iVar2;
  void *recvbuf;
  long lVar3;
  size_t size;
  size_t size_00;
  size_t size_01;
  long lVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  char OutputString [256];
  
  if (Stream->Rank == 0) {
    recvbuf = malloc((long)Stream->CohortSize * 0x60);
  }
  else {
    recvbuf = (void *)0x0;
  }
  SMPI_Gather(&Stream->Stats,0x60,SMPI_CHAR,recvbuf,0x60,SMPI_CHAR,0,Stream->mpiComm);
  if (Stream->Rank == 0) {
    iVar2 = Stream->CohortSize;
    if ((long)iVar2 < 2) {
      dVar5 = *(double *)((long)recvbuf + 0x58);
    }
    else {
      lVar6 = *(long *)((long)recvbuf + 0x30);
      lVar7 = *(long *)((long)recvbuf + 0x38);
      lVar3 = *(long *)((long)recvbuf + 0x40);
      dVar5 = *(double *)((long)recvbuf + 0x58);
      lVar4 = 0;
      do {
        plVar1 = (long *)((long)recvbuf + lVar4 + 0x90);
        lVar6 = lVar6 + *plVar1;
        lVar7 = lVar7 + plVar1[1];
        lVar3 = lVar3 + *(long *)((long)recvbuf + lVar4 + 0xa0);
        dVar5 = dVar5 + *(double *)((long)recvbuf + lVar4 + 0xb8);
        lVar4 = lVar4 + 0x60;
      } while ((long)iVar2 * 0x60 + -0x60 != lVar4);
      *(long *)((long)recvbuf + 0x30) = lVar6;
      *(long *)((long)recvbuf + 0x38) = lVar7;
      *(long *)((long)recvbuf + 0x40) = lVar3;
    }
    *(double *)((long)recvbuf + 0x58) = dVar5 / (double)iVar2;
    CP_verbose(Stream,SummaryVerbose,"\nStream \"%s\" (%p) summary info:\n",Stream->Filename,Stream)
    ;
    CP_verbose(Stream,SummaryVerbose,"\tDuration (secs) = %g\n",(Stream->Stats).StreamValidTimeSecs)
    ;
    if (Stream->Role == ReaderRole) {
      CP_verbose(Stream,SummaryVerbose,"\tTimestep Metadata Received = %zu\n",
                 (Stream->Stats).TimestepMetadataReceived);
      CP_verbose(Stream,SummaryVerbose,"\tTimesteps Consumed = %zu\n",
                 (Stream->Stats).TimestepsConsumed);
      ReadableSizeString(*(size_t *)((long)recvbuf + 0x30),OutputString,size);
      CP_verbose(Stream,SummaryVerbose,"\tMetadataBytesReceived = %zu (%s)\n",
                 *(undefined8 *)((long)recvbuf + 0x30),OutputString);
      ReadableSizeString(*(size_t *)((long)recvbuf + 0x38),OutputString,size_00);
      CP_verbose(Stream,SummaryVerbose,"\tDataBytesReceived = %zu (%s)\n",
                 *(undefined8 *)((long)recvbuf + 0x38),OutputString);
      ReadableSizeString(*(size_t *)((long)recvbuf + 0x40),OutputString,size_01);
      CP_verbose(Stream,SummaryVerbose,"\tPreloadBytesReceived = %zu (%s)\n",
                 *(undefined8 *)((long)recvbuf + 0x40),OutputString);
      CP_verbose(Stream,SummaryVerbose,"\tPreloadTimestepsReceived = %zu\n",
                 (Stream->Stats).PreloadTimestepsReceived);
      CP_verbose(Stream,SummaryVerbose,"\tAverageReadRankFanIn = %.1f\n",
                 *(undefined8 *)((long)recvbuf + 0x58));
    }
    else if (Stream->Role == WriterRole) {
      CP_verbose(Stream,SummaryVerbose,"\tTimesteps Created = %zu\n",
                 (Stream->Stats).TimestepsCreated);
      CP_verbose(Stream,SummaryVerbose,"\tTimesteps Delivered = %zu\n",
                 (Stream->Stats).TimestepsDelivered);
    }
    CP_verbose(Stream,SummaryVerbose,"\n");
    free(recvbuf);
  }
  return;
}

Assistant:

extern void DoStreamSummary(SstStream Stream)
{
    SstStats AllStats = NULL;

    if (Stream->Rank == 0)
        AllStats = malloc(sizeof(struct _SstStats) * Stream->CohortSize);

    SMPI_Gather(&Stream->Stats, sizeof(struct _SstStats), SMPI_CHAR, AllStats,
                sizeof(struct _SstStats), SMPI_CHAR, 0, Stream->mpiComm);

    if (Stream->Rank != 0)
    {
        return;
    }

    for (int i = 1; i < Stream->CohortSize; i++)
    {
        AllStats[0].MetadataBytesReceived += AllStats[i].MetadataBytesReceived;
        AllStats[0].DataBytesReceived += AllStats[i].DataBytesReceived;
        AllStats[0].PreloadBytesReceived += AllStats[i].PreloadBytesReceived;
        AllStats[0].RunningFanIn += AllStats[i].RunningFanIn;
    }
    AllStats[0].RunningFanIn /= Stream->CohortSize;

    CP_verbose(Stream, SummaryVerbose, "\nStream \"%s\" (%p) summary info:\n", Stream->Filename,
               (void *)Stream);
    CP_verbose(Stream, SummaryVerbose, "\tDuration (secs) = %g\n",
               Stream->Stats.StreamValidTimeSecs);
    if (Stream->Role == WriterRole)
    {
        CP_verbose(Stream, SummaryVerbose, "\tTimesteps Created = %zu\n",
                   Stream->Stats.TimestepsCreated);
        CP_verbose(Stream, SummaryVerbose, "\tTimesteps Delivered = %zu\n",
                   Stream->Stats.TimestepsDelivered);
    }
    else if (Stream->Role == ReaderRole)
    {
        char OutputString[256];
        CP_verbose(Stream, SummaryVerbose, "\tTimestep Metadata Received = %zu\n",
                   Stream->Stats.TimestepMetadataReceived);
        CP_verbose(Stream, SummaryVerbose, "\tTimesteps Consumed = %zu\n",
                   Stream->Stats.TimestepsConsumed);
        ReadableSizeString(AllStats[0].MetadataBytesReceived, OutputString, sizeof(OutputString));
        CP_verbose(Stream, SummaryVerbose, "\tMetadataBytesReceived = %zu (%s)\n",
                   AllStats[0].MetadataBytesReceived, OutputString);
        ReadableSizeString(AllStats[0].DataBytesReceived, OutputString, sizeof(OutputString));
        CP_verbose(Stream, SummaryVerbose, "\tDataBytesReceived = %zu (%s)\n",
                   AllStats[0].DataBytesReceived, OutputString);
        ReadableSizeString(AllStats[0].PreloadBytesReceived, OutputString, sizeof(OutputString));
        CP_verbose(Stream, SummaryVerbose, "\tPreloadBytesReceived = %zu (%s)\n",
                   AllStats[0].PreloadBytesReceived, OutputString);
        CP_verbose(Stream, SummaryVerbose, "\tPreloadTimestepsReceived = %zu\n",
                   Stream->Stats.PreloadTimestepsReceived);
        CP_verbose(Stream, SummaryVerbose, "\tAverageReadRankFanIn = %.1f\n",
                   AllStats[0].RunningFanIn);
    }
    CP_verbose(Stream, SummaryVerbose, "\n");
    free(AllStats);
}